

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

Matrix4x4 * CMU462::Matrix4x4::scaling(Matrix4x4 *__return_storage_ptr__,Vector3D *s)

{
  double dVar1;
  double *pdVar2;
  Vector3D *s_local;
  Matrix4x4 *B;
  
  identity();
  dVar1 = s->x;
  pdVar2 = operator()(__return_storage_ptr__,0,0);
  *pdVar2 = dVar1;
  dVar1 = s->y;
  pdVar2 = operator()(__return_storage_ptr__,1,1);
  *pdVar2 = dVar1;
  dVar1 = s->z;
  pdVar2 = operator()(__return_storage_ptr__,2,2);
  *pdVar2 = dVar1;
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 Matrix4x4::scaling(Vector3D s) {
    Matrix4x4 B = Matrix4x4::identity();
    B(0, 0) = s.x;
    B(1, 1) = s.y;
    B(2, 2) = s.z;

    return B;
  }